

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

void __thiscall helics::FederateInfo::config_additional(FederateInfo *this,App *app)

{
  string *this_00;
  bool bVar1;
  Option *this_01;
  char *extraout_RDX;
  char *extraout_RDX_00;
  string_view tomlString;
  string_view jsonString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"--config",(allocator<char> *)&local_60);
  this_01 = CLI::App::get_option(app,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    CLI::Option::as<std::__cxx11::string>(&local_60,this_01);
    this_00 = &this->configString;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    CLI::Validator::operator()(&local_60,(Validator *)CLI::ExistingFile,this_00);
    std::__cxx11::string::~string((string *)&local_60);
    if (local_60._M_string_length == 0) {
      tomlString._M_str = extraout_RDX;
      tomlString._M_len = (size_t)(this->configString)._M_dataplus._M_p;
      bVar1 = fileops::hasTomlExtension((fileops *)(this->configString)._M_string_length,tomlString)
      ;
      if (bVar1) {
        loadInfoFromToml(this,this_00,false);
      }
      else {
        jsonString._M_str = extraout_RDX_00;
        jsonString._M_len = (size_t)(this->configString)._M_dataplus._M_p;
        bVar1 = fileops::hasJsonExtension
                          ((fileops *)(this->configString)._M_string_length,jsonString);
        if (!bVar1) {
          return;
        }
        loadInfoFromJson(this,this_00,false);
      }
      this->fileInUse = true;
    }
  }
  return;
}

Assistant:

void FederateInfo::config_additional(CLI::App* app)
{
    auto* opt = app->get_option("--config");
    if (opt->count() > 0) {
        configString = opt->as<std::string>();
        if (CLI::ExistingFile(configString).empty()) {
            if (fileops::hasTomlExtension(configString)) {
                loadInfoFromToml(configString, false);
                fileInUse = true;

            } else if (fileops::hasJsonExtension(configString)) {
                loadInfoFromJson(configString, false);
                fileInUse = true;
            }
        }
    }
}